

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-as.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  Options *this;
  bool bVar1;
  char cVar2;
  mapped_type *pmVar3;
  string *psVar4;
  iterator iVar5;
  ostream *poVar6;
  Module local_bb0;
  undefined1 local_7c0 [8];
  ToolOptions options;
  _Any_data local_618;
  code *local_608;
  code *local_600;
  _Any_data local_5f8;
  code *local_5e8;
  code *local_5e0;
  _Any_data local_5d8;
  code *local_5c8;
  code *local_5c0;
  _Any_data local_5b8;
  code *local_5a8;
  code *local_5a0;
  _Any_data local_598;
  code *local_588;
  code *local_580;
  _Any_data local_578;
  code *local_568;
  code *local_560;
  undefined1 local_558 [16];
  undefined1 local_548 [16];
  size_type local_538;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_530;
  _Alloc_hider local_520;
  size_type local_518;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_510;
  _Alloc_hider local_500;
  size_type local_4f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f0 [18];
  string local_3d0 [32];
  string local_3b0 [32];
  string local_390 [32];
  string local_370 [32];
  string local_350 [32];
  string local_330 [32];
  string local_310 [32];
  string local_2f0 [32];
  string local_2d0 [32];
  string local_2b0 [32];
  string local_290 [32];
  string local_270 [32];
  string local_250 [32];
  string local_230;
  string local_210;
  string local_1f0 [32];
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [32];
  size_type *local_170;
  string sourceMapUrl;
  size_type *local_130;
  string symbolMap;
  string sourceMapFilename;
  string local_d0 [8];
  string WasmAsOption;
  undefined1 local_90 [8];
  Result<wasm::Ok> parsed;
  __index_type local_70;
  undefined1 auStack_68 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> input;
  allocator<char> local_40;
  allocator<char> local_3f;
  allocator<char> local_3e;
  allocator<char> local_3d;
  allocator<char> local_3c;
  allocator<char> local_3b;
  allocator<char> local_3a;
  allocator<char> local_39;
  allocator<char> local_38;
  allocator<char> local_37;
  allocator<char> local_36;
  allocator<char> local_35;
  allocator<char> local_34;
  allocator<char> local_33;
  allocator<char> local_32;
  string local_31 [8];
  bool debugInfo;
  
  local_130 = &symbolMap._M_string_length;
  symbolMap._M_dataplus._M_p = (pointer)0x0;
  symbolMap._M_string_length._0_1_ = 0;
  symbolMap.field_2._8_8_ = &sourceMapFilename._M_string_length;
  sourceMapFilename._M_dataplus._M_p = (pointer)0x0;
  local_31[0] = (string)0x0;
  sourceMapFilename._M_string_length._0_1_ = 0;
  local_170 = &sourceMapUrl._M_string_length;
  sourceMapUrl._M_dataplus._M_p = (pointer)0x0;
  sourceMapUrl._M_string_length._0_1_ = 0;
  std::__cxx11::string::string<std::allocator<char>>
            (local_d0,"wasm-as options",(allocator<char> *)&local_bb0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_bb0,"wasm-as",(allocator<char> *)local_90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_558,
             "Assemble a .wat (WebAssembly text format) into a .wasm (WebAssembly binary format)",
             (allocator<char> *)auStack_68);
  wasm::ToolOptions::ToolOptions((ToolOptions *)local_7c0,(string *)&local_bb0,(string *)local_558);
  std::__cxx11::string::~string((string *)local_558);
  std::__cxx11::string::~string((string *)&local_bb0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_bb0,"validate",(allocator<char> *)local_558);
  this = &options.super_Options;
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)this,(key_type *)&local_bb0);
  std::__cxx11::string::assign((char *)pmVar3);
  std::__cxx11::string::~string((string *)&local_bb0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_bb0,"--output",(allocator<char> *)(input.field_2._M_local_buf + 0xc));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_558,"-o",(allocator<char> *)(input.field_2._M_local_buf + 0xd));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_90,"Output file",(allocator<char> *)(input.field_2._M_local_buf + 0xe))
  ;
  auStack_68 = (undefined1  [8])0x0;
  input._M_dataplus._M_p = (pointer)0x0;
  input.field_2._M_allocated_capacity =
       (size_type)
       std::
       _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-as.cpp:50:10)>
       ::_M_invoke;
  input._M_string_length =
       (size_type)
       std::
       _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-as.cpp:50:10)>
       ::_M_manager;
  psVar4 = (string *)
           wasm::Options::add((string *)&options,(string *)&local_bb0,(string *)local_558,
                              (string *)local_90,(Arguments)local_d0,(function *)0x1,
                              SUB81((allocator<char> *)auStack_68,0));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(WasmAsOption.field_2._M_local_buf + 8),"--validate",
             (allocator<char> *)(input.field_2._M_local_buf + 0xf));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(sourceMapFilename.field_2._M_local_buf + 8),"-v",&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(sourceMapUrl.field_2._M_local_buf + 8),
             "Control validation of the output module",&local_3f);
  local_598._M_unused._M_object = (void *)0x0;
  local_598._8_8_ = 0;
  local_580 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-as.cpp:59:10)>
              ::_M_invoke;
  local_588 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-as.cpp:59:10)>
              ::_M_manager;
  psVar4 = (string *)
           wasm::Options::add(psVar4,(string *)(WasmAsOption.field_2._M_local_buf + 8),
                              (string *)(sourceMapFilename.field_2._M_local_buf + 8),
                              (string *)(sourceMapUrl.field_2._M_local_buf + 8),(Arguments)local_d0,
                              (function *)0x1,SUB81(&local_598,0));
  std::__cxx11::string::string<std::allocator<char>>(local_3d0,"--debuginfo",&local_3e);
  std::__cxx11::string::string<std::allocator<char>>(local_3b0,"-g",&local_3d);
  std::__cxx11::string::string<std::allocator<char>>
            (local_390,"Emit names section and debug info",&local_3c);
  local_618._8_8_ = 0;
  local_618._M_unused._M_object = local_31;
  local_600 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-as.cpp:71:10)>
              ::_M_invoke;
  local_608 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-as.cpp:71:10)>
              ::_M_manager;
  psVar4 = (string *)
           wasm::Options::add(psVar4,local_3d0,local_3b0,local_390,(Arguments)local_d0,
                              (function *)0x0,SUB81(&local_618,0));
  std::__cxx11::string::string<std::allocator<char>>(local_370,"--source-map",&local_3b);
  std::__cxx11::string::string<std::allocator<char>>(local_350,"-sm",&local_3a);
  std::__cxx11::string::string<std::allocator<char>>
            (local_330,"Emit source map to the specified file",&local_39);
  local_5f8._8_8_ = 0;
  local_5f8._M_unused._0_8_ = (undefined8)((long)&symbolMap.field_2 + 8);
  local_5e0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-as.cpp:77:10)>
              ::_M_invoke;
  local_5e8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-as.cpp:77:10)>
              ::_M_manager;
  psVar4 = (string *)
           wasm::Options::add(psVar4,local_370,local_350,local_330,(Arguments)local_d0,
                              (function *)0x1,SUB81(&local_5f8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_310,"--source-map-url",&local_38);
  std::__cxx11::string::string<std::allocator<char>>(local_2f0,"-su",&local_37);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2d0,"Use specified string as source map URL",&local_36);
  local_5d8._8_8_ = 0;
  local_5d8._M_unused._M_object = &local_170;
  local_5c0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-as.cpp:85:10)>
              ::_M_invoke;
  local_5c8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-as.cpp:85:10)>
              ::_M_manager;
  psVar4 = (string *)
           wasm::Options::add(psVar4,local_310,local_2f0,local_2d0,(Arguments)local_d0,
                              (function *)0x1,SUB81(&local_5d8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_2b0,"--symbolmap",&local_35);
  std::__cxx11::string::string<std::allocator<char>>(local_290,"-s",&local_34);
  std::__cxx11::string::string<std::allocator<char>>
            (local_270,"Emit a symbol map (indexes => names)",&local_33);
  local_5b8._8_8_ = 0;
  local_5b8._M_unused._M_object = &local_130;
  local_5a0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-as.cpp:93:10)>
              ::_M_invoke;
  local_5a8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-as.cpp:93:10)>
              ::_M_manager;
  psVar4 = (string *)
           wasm::Options::add(psVar4,local_2b0,local_290,local_270,(Arguments)local_d0,
                              (function *)0x1,SUB81(&local_5b8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_250,"INFILE",&local_32);
  local_578._M_unused._M_object = (void *)0x0;
  local_578._8_8_ = 0;
  local_560 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-as.cpp:96:21)>
              ::_M_invoke;
  local_568 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-as.cpp:96:21)>
              ::_M_manager;
  wasm::Options::add_positional(psVar4,(Arguments)local_250,(function *)0x1);
  std::_Function_base::~_Function_base((_Function_base *)&local_578);
  std::__cxx11::string::~string(local_250);
  std::_Function_base::~_Function_base((_Function_base *)&local_5b8);
  std::__cxx11::string::~string(local_270);
  std::__cxx11::string::~string(local_290);
  std::__cxx11::string::~string(local_2b0);
  std::_Function_base::~_Function_base((_Function_base *)&local_5d8);
  std::__cxx11::string::~string(local_2d0);
  std::__cxx11::string::~string(local_2f0);
  std::__cxx11::string::~string(local_310);
  std::_Function_base::~_Function_base((_Function_base *)&local_5f8);
  std::__cxx11::string::~string(local_330);
  std::__cxx11::string::~string(local_350);
  std::__cxx11::string::~string(local_370);
  std::_Function_base::~_Function_base((_Function_base *)&local_618);
  std::__cxx11::string::~string(local_390);
  std::__cxx11::string::~string(local_3b0);
  std::__cxx11::string::~string(local_3d0);
  std::_Function_base::~_Function_base((_Function_base *)&local_598);
  std::__cxx11::string::~string((string *)(sourceMapUrl.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sourceMapFilename.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(WasmAsOption.field_2._M_local_buf + 8));
  std::_Function_base::~_Function_base((_Function_base *)auStack_68);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)local_558);
  std::__cxx11::string::~string((string *)&local_bb0);
  wasm::Options::parse((int)&options,(char **)(ulong)(uint)argc);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_bb0,"output",(allocator<char> *)local_558);
  iVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)this,(key_type *)&local_bb0);
  std::__cxx11::string::~string((string *)&local_bb0);
  if (iVar5._M_node == (_Base_ptr)&options.field_0x10) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_90,"infile",
               (allocator<char> *)(WasmAsOption.field_2._M_local_buf + 8));
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)this,(key_type *)local_90);
    std::__cxx11::string::string((string *)&local_230,(string *)pmVar3);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_210,".wat",
               (allocator<char> *)(sourceMapFilename.field_2._M_local_buf + 8));
    wasm::removeSpecificSuffix((string *)local_558,&local_230,&local_210);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_bb0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_558,
                   ".wasm");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)auStack_68,"output",
               (allocator<char> *)(sourceMapUrl.field_2._M_local_buf + 8));
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)this,(key_type *)auStack_68);
    std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_bb0);
    std::__cxx11::string::~string((string *)auStack_68);
    std::__cxx11::string::~string((string *)&local_bb0);
    std::__cxx11::string::~string((string *)local_558);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)local_90);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_bb0,"infile",(allocator<char> *)local_558);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)this,(key_type *)&local_bb0);
  wasm::read_file<std::__cxx11::string>((string *)auStack_68,(BinaryOption)pmVar3);
  std::__cxx11::string::~string((string *)&local_bb0);
  wasm::Module::Module(&local_bb0);
  local_bb0.features.features = ~options.profile & (local_bb0.features.features | options._368_4_);
  wasm::WATParser::parseModule(local_90,&local_bb0,input._M_dataplus._M_p,auStack_68);
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&options.enabledFeatures);
  if (local_70 == '\x01') {
    wasm::Fatal::Fatal((Fatal *)local_558);
    wasm::Fatal::operator<<
              ((Fatal *)local_558,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90);
LAB_0010e096:
    wasm::Fatal::~Fatal((Fatal *)local_558);
  }
  if (options.passOptions.passesToSkip._M_h._M_single_bucket._1_1_ == '\0') {
    std::
    _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::clear(&local_bb0.typeIndices._M_h);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_558,"validate",
             (allocator<char> *)(WasmAsOption.field_2._M_local_buf + 8));
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)this,(key_type *)local_558);
  bVar1 = std::operator!=(pmVar3,"none");
  std::__cxx11::string::~string((string *)local_558);
  if (bVar1) {
    if ((char)options._vptr_ToolOptions == '\x01') {
      poVar6 = std::operator<<((ostream *)&std::cerr,"Validating...");
      std::endl<char,std::char_traits<char>>(poVar6);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_558,"validate",
               (allocator<char> *)(sourceMapFilename.field_2._M_local_buf + 8));
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)this,(key_type *)local_558);
    std::operator==(pmVar3,"web");
    cVar2 = wasm::WasmValidator::validate
                      ((Module *)((long)&WasmAsOption.field_2 + 8),(uint)&local_bb0);
    std::__cxx11::string::~string((string *)local_558);
    if (cVar2 == '\0') {
      wasm::Fatal::Fatal((Fatal *)local_558);
      wasm::Fatal::operator<<
                ((Fatal *)local_558,(char (*) [35])"Error: input module is not valid.\n");
      goto LAB_0010e096;
    }
  }
  if ((char)options._vptr_ToolOptions == '\x01') {
    poVar6 = std::operator<<((ostream *)&std::cerr,"writing...");
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  local_558._8_8_ = &options.field_0xb0;
  local_548._8_8_ = &local_530;
  local_538 = 0;
  local_530._M_local_buf[0] = '\0';
  local_520._M_p = (pointer)&local_510;
  local_518 = 0;
  local_510._M_local_buf[0] = '\0';
  local_500._M_p = (pointer)local_4f0;
  local_4f8 = 0;
  local_4f0[0]._M_local_buf[0] = '\0';
  local_548._0_2_ = 1;
  local_558[0] = (bool)local_31[0];
  if (sourceMapFilename._M_dataplus._M_p != (pointer)0x0) {
    std::__cxx11::string::string(local_1f0,(string *)(symbolMap.field_2._M_local_buf + 8));
    std::__cxx11::string::_M_assign((string *)&local_520);
    std::__cxx11::string::~string(local_1f0);
    std::__cxx11::string::string(local_1d0,(string *)&local_170);
    std::__cxx11::string::_M_assign((string *)&local_500);
    std::__cxx11::string::~string(local_1d0);
  }
  if (symbolMap._M_dataplus._M_p != (pointer)0x0) {
    std::__cxx11::string::string(local_1b0,(string *)&local_130);
    std::__cxx11::string::_M_assign((string *)(local_548 + 8));
    std::__cxx11::string::~string(local_1b0);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(WasmAsOption.field_2._M_local_buf + 8),"output",
             (allocator<char> *)(sourceMapFilename.field_2._M_local_buf + 8));
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)this,(key_type *)((long)&WasmAsOption.field_2 + 8));
  std::__cxx11::string::string(local_190,(string *)pmVar3);
  wasm::ModuleWriter::write(local_558,&local_bb0,local_190);
  std::__cxx11::string::~string(local_190);
  std::__cxx11::string::~string((string *)(WasmAsOption.field_2._M_local_buf + 8));
  if ((char)options._vptr_ToolOptions == '\x01') {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Done.");
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  wasm::ModuleWriter::~ModuleWriter((ModuleWriter *)local_558);
  std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_90);
  wasm::Module::~Module(&local_bb0);
  std::__cxx11::string::~string((string *)auStack_68);
  wasm::ToolOptions::~ToolOptions((ToolOptions *)local_7c0);
  std::__cxx11::string::~string(local_d0);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)(symbolMap.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_130);
  return 0;
}

Assistant:

int main(int argc, const char* argv[]) {
  bool debugInfo = false;
  std::string symbolMap;
  std::string sourceMapFilename;
  std::string sourceMapUrl;

  const std::string WasmAsOption = "wasm-as options";

  ToolOptions options("wasm-as",
                      "Assemble a .wat (WebAssembly text format) into a .wasm "
                      "(WebAssembly binary format)");
  options.extra["validate"] = "wasm";
  options
    .add("--output",
         "-o",
         "Output file",
         WasmAsOption,
         Options::Arguments::One,
         [](Options* o, const std::string& argument) {
           o->extra["output"] = argument;
           Colors::setEnabled(false);
         })
    .add("--validate",
         "-v",
         "Control validation of the output module",
         WasmAsOption,
         Options::Arguments::One,
         [](Options* o, const std::string& argument) {
           if (argument != "web" && argument != "none" && argument != "wasm") {
             Fatal() << "Valid arguments for --validate flag are 'wasm', "
                        "'web', and 'none'.\n";
           }
           o->extra["validate"] = argument;
         })
    .add("--debuginfo",
         "-g",
         "Emit names section and debug info",
         WasmAsOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& arguments) { debugInfo = true; })
    .add("--source-map",
         "-sm",
         "Emit source map to the specified file",
         WasmAsOption,
         Options::Arguments::One,
         [&sourceMapFilename](Options* o, const std::string& argument) {
           sourceMapFilename = argument;
         })
    .add("--source-map-url",
         "-su",
         "Use specified string as source map URL",
         WasmAsOption,
         Options::Arguments::One,
         [&sourceMapUrl](Options* o, const std::string& argument) {
           sourceMapUrl = argument;
         })
    .add("--symbolmap",
         "-s",
         "Emit a symbol map (indexes => names)",
         WasmAsOption,
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) { symbolMap = argument; })
    .add_positional("INFILE",
                    Options::Arguments::One,
                    [](Options* o, const std::string& argument) {
                      o->extra["infile"] = argument;
                    });
  options.parse(argc, argv);

  // default output is infile with changed suffix
  if (options.extra.find("output") == options.extra.end()) {
    options.extra["output"] =
      removeSpecificSuffix(options.extra["infile"], ".wat") + ".wasm";
  }

  auto input(read_file<std::string>(options.extra["infile"], Flags::Text));

  Module wasm;
  options.applyOptionsBeforeParse(wasm);

  auto parsed = WATParser::parseModule(wasm, input);
  if (auto* err = parsed.getErr()) {
    Fatal() << err->msg;
  }

  options.applyOptionsAfterParse(wasm);

  if (options.extra["validate"] != "none") {
    if (options.debug) {
      std::cerr << "Validating..." << std::endl;
    }
    if (!wasm::WasmValidator().validate(
          wasm,
          WasmValidator::Globally |
            (options.extra["validate"] == "web" ? WasmValidator::Web : 0))) {
      Fatal() << "Error: input module is not valid.\n";
    }
  }

  if (options.debug) {
    std::cerr << "writing..." << std::endl;
  }
  ModuleWriter writer(options.passOptions);
  writer.setBinary(true);
  writer.setDebugInfo(debugInfo);
  if (sourceMapFilename.size()) {
    writer.setSourceMapFilename(sourceMapFilename);
    writer.setSourceMapUrl(sourceMapUrl);
  }
  if (symbolMap.size() > 0) {
    writer.setSymbolMap(symbolMap);
  }
  writer.write(wasm, options.extra["output"]);

  if (options.debug) {
    std::cerr << "Done." << std::endl;
  }
}